

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraKateGenerator::GenerateProjectName
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,string *name,string *type,
          string *path)

{
  char cVar1;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *path_local;
  string *type_local;
  string *name_local;
  cmExtraKateGenerator *this_local;
  
  local_30 = path;
  path_local = type;
  type_local = name;
  name_local = (string *)this;
  this_local = (cmExtraKateGenerator *)__return_storage_ptr__;
  cVar1 = std::__cxx11::string::empty();
  __rhs = "-";
  if (cVar1 != '\0') {
    __rhs = "";
  }
  std::operator+(&local_90,name,__rhs);
  std::operator+(&local_70,&local_90,path_local);
  std::operator+(&local_50,&local_70,"@");
  std::operator+(__return_storage_ptr__,&local_50,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateProjectName(const std::string& name,
                                                 const std::string& type,
                                                 const std::string& path) const
{
  return name + (type.empty() ? "" : "-") + type + "@" + path;
}